

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTMath.cpp
# Opt level: O3

RTVector3 * __thiscall RTVector3::operator=(RTVector3 *this,RTVector3 *vec)

{
  if (this != vec) {
    this->m_data[0] = vec->m_data[0];
    this->m_data[1] = vec->m_data[1];
    this->m_data[2] = vec->m_data[2];
  }
  return this;
}

Assistant:

RTVector3& RTVector3::operator =(const RTVector3& vec)
{
    if (this == &vec)
        return *this;

    m_data[0] = vec.m_data[0];
    m_data[1] = vec.m_data[1];
    m_data[2] = vec.m_data[2];

    return *this;
}